

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget_p.h
# Opt level: O2

void __thiscall QWidgetPrivate::setSharedPainter(QWidgetPrivate *this,QPainter *painter)

{
  QWidget *pQVar1;
  QTLWExtra *pQVar2;
  
  pQVar1 = QWidget::window(*(QWidget **)&this->field_0x8);
  pQVar2 = topData(*(QWidgetPrivate **)&pQVar1->field_0x8);
  pQVar2->sharedPainter = painter;
  return;
}

Assistant:

inline void QWidgetPrivate::setSharedPainter(QPainter *painter)
{
    Q_Q(QWidget);
    QTLWExtra *x = q->window()->d_func()->topData();
    x->sharedPainter = painter;
}